

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPipelineStatisticsQueryTests.cpp
# Opt level: O0

bool __thiscall
glcts::PipelineStatisticsQueryTestFunctional3::executeTest
          (PipelineStatisticsQueryTestFunctional3 *this,GLenum current_query_target)

{
  GLuint qo_id;
  GLuint qo_bo_id;
  TestContext *test_context;
  bool bVar1;
  int iVar2;
  GLenum GVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  ContextInfo *context_info;
  TestLog *this_00;
  MessageBuilder *pMVar5;
  GLenum value;
  _verification_type local_2d0;
  uint local_2cc;
  _verification_type verification_type;
  uint n_expected_values;
  GLuint64 expected_values [4];
  string local_2a0;
  MessageBuilder local_270;
  _draw_call_type local_f0;
  _primitive_type local_ec;
  uint n_draw_call_type;
  uint n_primitive_type;
  uint n_pr_status;
  uint n_pr_statuses;
  bool pr_statuses [2];
  undefined8 uStack_d8;
  uint n_indices;
  uint index_data [7];
  float vertex_data [16];
  undefined1 local_70 [4];
  uint n_vertex_components;
  _test_execution_result run_result;
  bool result;
  Functions *gl;
  GLenum current_query_target_local;
  PipelineStatisticsQueryTestFunctional3 *this_local;
  Functions *gl_00;
  
  pRVar4 = deqp::Context::getRenderContext
                     ((this->super_PipelineStatisticsQueryTestFunctionalBase).super_TestCase.
                      m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar2);
  run_result.result_uint64._7_1_ = 1;
  PipelineStatisticsQueryUtilities::_test_execution_result::_test_execution_result
            ((_test_execution_result *)local_70);
  memcpy(index_data + 6,&DAT_02a569f0,0x40);
  uStack_d8 = 0x600000000;
  index_data[0] = 2;
  index_data[1] = 1;
  index_data[2] = 3;
  index_data[3] = 5;
  index_data[4] = 4;
  n_pr_statuses = 7;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).m_indirect_draw_call_baseinstance_argument
       = 1;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).m_indirect_draw_call_basevertex_argument =
       0;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).m_indirect_draw_call_count_argument = 7;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).m_indirect_draw_call_first_argument = 0;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).m_indirect_draw_call_primcount_argument =
       3;
  PipelineStatisticsQueryTestFunctionalBase::initVBO
            (&this->super_PipelineStatisticsQueryTestFunctionalBase,(float *)(index_data + 6),0x40,
             (uint *)&stack0xffffffffffffff28,0x1c,
             (this->super_PipelineStatisticsQueryTestFunctionalBase).
             m_indirect_draw_call_count_argument,
             (this->super_PipelineStatisticsQueryTestFunctionalBase).
             m_indirect_draw_call_primcount_argument,
             (this->super_PipelineStatisticsQueryTestFunctionalBase).
             m_indirect_draw_call_baseinstance_argument,
             (this->super_PipelineStatisticsQueryTestFunctionalBase).
             m_indirect_draw_call_first_argument,
             (this->super_PipelineStatisticsQueryTestFunctionalBase).
             m_indirect_draw_call_basevertex_argument);
  PipelineStatisticsQueryTestFunctionalBase::initVAO
            (&this->super_PipelineStatisticsQueryTestFunctionalBase,2);
  n_pr_status._2_2_ = 0x100;
  n_primitive_type = 2;
  for (n_draw_call_type = 0; n_draw_call_type < 2; n_draw_call_type = n_draw_call_type + 1) {
    this->m_is_primitive_restart_enabled =
         (bool)(*(byte *)((long)&n_pr_status + (ulong)n_draw_call_type + 2) & 1);
    if (((current_query_target != 0x82f6) && (current_query_target != 0x82f7)) ||
       ((this->m_is_primitive_restart_enabled & 1U) == 0)) {
      if ((this->m_is_primitive_restart_enabled & 1U) == 0) {
        (*gl_00->disable)(0x8f9d);
        GVar3 = (*gl_00->getError)();
        glu::checkError(GVar3,"glDisable() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cPipelineStatisticsQueryTests.cpp"
                        ,0xbcf);
      }
      else {
        (*gl_00->primitiveRestartIndex)(0);
        GVar3 = (*gl_00->getError)();
        glu::checkError(GVar3,"glPrimitiveRestartIndex() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cPipelineStatisticsQueryTests.cpp"
                        ,0xbd4);
        (*gl_00->enable)(0x8f9d);
        GVar3 = (*gl_00->getError)();
        glu::checkError(GVar3,"glEnable() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cPipelineStatisticsQueryTests.cpp"
                        ,0xbd7);
      }
      for (local_ec = PRIMITIVE_TYPE_FIRST; local_ec < PRIMITIVE_TYPE_COUNT;
          local_ec = local_ec + PRIMITIVE_TYPE_LINE_LOOP) {
        (this->super_PipelineStatisticsQueryTestFunctionalBase).m_current_primitive_type = local_ec;
        if ((this->super_PipelineStatisticsQueryTestFunctionalBase).m_current_primitive_type !=
            PRIMITIVE_TYPE_PATCHES) {
          local_f0 = DRAW_CALL_TYPE_GLDRAWARRAYS;
          if ((this->m_is_primitive_restart_enabled & 1U) != 0) {
            local_f0 = DRAW_CALL_TYPE_GLDRAWELEMENTS;
          }
          for (; local_f0 < DRAW_CALL_TYPE_COUNT;
              local_f0 = local_f0 + DRAW_CALL_TYPE_GLDRAWARRAYSINDIRECT) {
            (this->super_PipelineStatisticsQueryTestFunctionalBase).m_current_draw_call_type =
                 local_f0;
            bVar1 = PipelineStatisticsQueryUtilities::isDrawCallSupported
                              ((this->super_PipelineStatisticsQueryTestFunctionalBase).
                               m_current_draw_call_type,gl_00);
            if (bVar1) {
              qo_id = (this->super_PipelineStatisticsQueryTestFunctionalBase).m_qo_id;
              qo_bo_id = (this->super_PipelineStatisticsQueryTestFunctionalBase).m_bo_qo_id;
              pRVar4 = deqp::Context::getRenderContext
                                 ((this->super_PipelineStatisticsQueryTestFunctionalBase).
                                  super_TestCase.m_context);
              test_context = (this->super_PipelineStatisticsQueryTestFunctionalBase).super_TestCase.
                             super_TestCase.super_TestNode.m_testCtx;
              context_info = deqp::Context::getContextInfo
                                       ((this->super_PipelineStatisticsQueryTestFunctionalBase).
                                        super_TestCase.m_context);
              bVar1 = PipelineStatisticsQueryUtilities::executeQuery
                                (current_query_target,qo_id,qo_bo_id,
                                 PipelineStatisticsQueryTestFunctionalBase::
                                 queryCallbackDrawCallHandler,this,pRVar4,test_context,context_info,
                                 (_test_execution_result *)local_70);
              if (bVar1) {
                memset(&verification_type,0,0x20);
                local_2cc = 0;
                local_2d0 = (_verification_type)(current_query_target == 0x82f7);
                if (current_query_target == 0x82ee) {
                  getExpectedVerticesSubmittedQueryResult
                            (this,(this->super_PipelineStatisticsQueryTestFunctionalBase).
                                  m_current_primitive_type,&local_2cc,(GLuint64 *)&verification_type
                            );
                }
                else {
                  getExpectedPrimitivesSubmittedQueryResult
                            (this,(this->super_PipelineStatisticsQueryTestFunctionalBase).
                                  m_current_primitive_type,&local_2cc,(GLuint64 *)&verification_type
                            );
                }
                bVar1 = PipelineStatisticsQueryUtilities::verifyResultValues
                                  ((_test_execution_result *)local_70,local_2cc,
                                   (GLuint64 *)&verification_type,
                                   (this->super_PipelineStatisticsQueryTestFunctionalBase).m_qo_id
                                   != 0,current_query_target,
                                   &(this->super_PipelineStatisticsQueryTestFunctionalBase).
                                    m_current_draw_call_type,
                                   &(this->super_PipelineStatisticsQueryTestFunctionalBase).
                                    m_current_primitive_type,
                                   (bool)(this->m_is_primitive_restart_enabled & 1),
                                   (this->super_PipelineStatisticsQueryTestFunctionalBase).
                                   super_TestCase.super_TestCase.super_TestNode.m_testCtx,local_2d0)
                ;
                run_result.result_uint64._7_1_ = (run_result.result_uint64._7_1_ & 1 & bVar1) != 0;
              }
              else {
                this_00 = tcu::TestContext::getLog
                                    ((this->super_PipelineStatisticsQueryTestFunctionalBase).
                                     super_TestCase.super_TestCase.super_TestNode.m_testCtx);
                tcu::TestLog::operator<<
                          (&local_270,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
                pMVar5 = tcu::MessageBuilder::operator<<
                                   (&local_270,
                                    (char (*) [55])
                                    "Could not retrieve test run results for query target [");
                PipelineStatisticsQueryUtilities::getStringForEnum_abi_cxx11_
                          (&local_2a0,
                           (PipelineStatisticsQueryUtilities *)(ulong)current_query_target,value);
                pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_2a0);
                pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x29dc08e);
                tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                std::__cxx11::string::~string((string *)&local_2a0);
                tcu::MessageBuilder::~MessageBuilder(&local_270);
                run_result.result_uint64._7_1_ = 0;
              }
            }
          }
        }
      }
    }
  }
  return (bool)(run_result.result_uint64._7_1_ & 1);
}

Assistant:

bool PipelineStatisticsQueryTestFunctional3::executeTest(glw::GLenum current_query_target)
{
	const glw::Functions&									 gl		= m_context.getRenderContext().getFunctions();
	bool													 result = true;
	PipelineStatisticsQueryUtilities::_test_execution_result run_result;

	/* Sanity check: This method should only be called for GL_VERTICES_SUBMITTED_ARB,
	 * GL_PRIMITIVES_SUBMITTED_ARB, GL_CLIPPING_INPUT_PRIMITIVES_ARB and
	 * GL_CLIPPING_OUTPUT_PRIMITIVES_ARB queries */
	DE_ASSERT(current_query_target == GL_VERTICES_SUBMITTED_ARB ||
			  current_query_target == GL_PRIMITIVES_SUBMITTED_ARB ||
			  current_query_target == GL_CLIPPING_INPUT_PRIMITIVES_ARB ||
			  current_query_target == GL_CLIPPING_OUTPUT_PRIMITIVES_ARB);

	/* Set up VBO. We don't really care much about the visual outcome,
	 * so any data will do.
	 */
	const unsigned int n_vertex_components = 2;
	const float		   vertex_data[]	   = { -0.1f, 0.2f, 0.3f,  0.1f,  0.2f,  -0.7f, 0.5f,  -0.5f,
								  0.0f,  0.0f, -0.6f, -0.9f, -0.3f, 0.3f,  -0.5f, -0.5f };
	const unsigned int index_data[] = {
		0, 6, 2, 1, 3, 5, 4,
	};
	const unsigned int n_indices = sizeof(index_data) / sizeof(index_data[0]);

	m_indirect_draw_call_baseinstance_argument = 1;
	m_indirect_draw_call_basevertex_argument   = 0;
	m_indirect_draw_call_count_argument		   = n_indices;
	m_indirect_draw_call_first_argument		   = 0;
	m_indirect_draw_call_primcount_argument	= 3;

	initVBO(vertex_data, sizeof(vertex_data), index_data, sizeof(index_data), m_indirect_draw_call_count_argument,
			m_indirect_draw_call_primcount_argument, m_indirect_draw_call_baseinstance_argument,
			m_indirect_draw_call_first_argument, m_indirect_draw_call_basevertex_argument);

	initVAO(n_vertex_components);

	/* Verify that the query works correctly both when primitive restart functionality
	 * is disabled and enabled */
	const bool		   pr_statuses[] = { false, true };
	const unsigned int n_pr_statuses = sizeof(pr_statuses) / sizeof(pr_statuses[0]);

	for (unsigned int n_pr_status = 0; n_pr_status < n_pr_statuses; ++n_pr_status)
	{
		m_is_primitive_restart_enabled = pr_statuses[n_pr_status];

		/* Primitive restart should never be enabled for GL_CLIPPING_INPUT_PRIMITIVES_ARB query. */
		if ((current_query_target == GL_CLIPPING_INPUT_PRIMITIVES_ARB ||
			 current_query_target == GL_CLIPPING_OUTPUT_PRIMITIVES_ARB) &&
			m_is_primitive_restart_enabled)
		{
			continue;
		}

		/* Configure 'primitive restart' functionality */
		if (!m_is_primitive_restart_enabled)
		{
			gl.disable(GL_PRIMITIVE_RESTART);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glDisable() call failed.");
		}
		else
		{
			gl.primitiveRestartIndex(0);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glPrimitiveRestartIndex() call failed.");

			gl.enable(GL_PRIMITIVE_RESTART);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable() call failed.");
		}

		/* Iterate through all primitive types */
		for (unsigned int n_primitive_type = 0;
			 n_primitive_type < PipelineStatisticsQueryUtilities::PRIMITIVE_TYPE_COUNT; ++n_primitive_type)
		{
			m_current_primitive_type = (PipelineStatisticsQueryUtilities::_primitive_type)n_primitive_type;

			/* Exclude patches from the test */
			if (m_current_primitive_type == PipelineStatisticsQueryUtilities::PRIMITIVE_TYPE_PATCHES)
			{
				continue;
			}

			/* Iterate through all draw call types while the query is enabled (skip DrawArrays calls if primitive restart is enabled) */
			for (unsigned int n_draw_call_type =
					 (m_is_primitive_restart_enabled ? PipelineStatisticsQueryUtilities::DRAW_CALL_TYPE_GLDRAWELEMENTS :
													   0);
				 n_draw_call_type < PipelineStatisticsQueryUtilities::DRAW_CALL_TYPE_COUNT; ++n_draw_call_type)
			{
				m_current_draw_call_type = (PipelineStatisticsQueryUtilities::_draw_call_type)n_draw_call_type;

				/* Only continue if the draw call is supported by the context */
				if (!PipelineStatisticsQueryUtilities::isDrawCallSupported(m_current_draw_call_type, gl))
				{
					continue;
				}

				if (!PipelineStatisticsQueryUtilities::executeQuery(
						current_query_target, m_qo_id, m_bo_qo_id, queryCallbackDrawCallHandler,
						(PipelineStatisticsQueryTestFunctionalBase*)this, m_context.getRenderContext(), m_testCtx,
						m_context.getContextInfo(), &run_result))
				{
					m_testCtx.getLog() << tcu::TestLog::Message
									   << "Could not retrieve test run results for query target "
										  "["
									   << PipelineStatisticsQueryUtilities::getStringForEnum(current_query_target)
									   << "]" << tcu::TestLog::EndMessage;

					result = false;
				}
				else
				{
					glw::GLuint64										 expected_values[4] = { 0 };
					unsigned int										 n_expected_values  = 0;
					PipelineStatisticsQueryUtilities::_verification_type verification_type =
						PipelineStatisticsQueryUtilities::VERIFICATION_TYPE_EXACT_MATCH;

					if (current_query_target == GL_CLIPPING_OUTPUT_PRIMITIVES_ARB)
					{
						verification_type = PipelineStatisticsQueryUtilities::VERIFICATION_TYPE_EQUAL_OR_GREATER;
					}

					if (current_query_target == GL_VERTICES_SUBMITTED_ARB)
					{
						getExpectedVerticesSubmittedQueryResult(m_current_primitive_type, &n_expected_values,
																expected_values);
					}
					else
					{
						getExpectedPrimitivesSubmittedQueryResult(m_current_primitive_type, &n_expected_values,
																  expected_values);
					}

					result &= PipelineStatisticsQueryUtilities::verifyResultValues(
						run_result, n_expected_values, expected_values, m_qo_id != 0, /* should_check_qo_bo_values */
						current_query_target, &m_current_draw_call_type, &m_current_primitive_type,
						m_is_primitive_restart_enabled, m_testCtx, verification_type);

				} /* if (run results were obtained successfully) */
			}	 /* for (all draw call types) */
		}		  /* for (all primitive types) */
	}			  /* for (both when primitive restart is disabled and enabled) */

	return result;
}